

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O0

bool __thiscall
CxxModuleUsage::AddReference(CxxModuleUsage *this,string *logical,string *loc,LookupMethod method)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  mapped_type *this_00;
  mapped_type *ref;
  string_view local_f0;
  string_view local_e0;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  anon_class_1_0_00000001 local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_48;
  anon_class_1_0_00000001 method_name;
  CxxModuleReference *ref_1;
  _Self local_38;
  iterator r;
  LookupMethod method_local;
  string *loc_local;
  string *logical_local;
  CxxModuleUsage *this_local;
  
  r._M_node._4_4_ = method;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
       ::find(&this->Reference,logical);
  ref_1 = (CxxModuleReference *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
          ::end(&this->Reference);
  bVar1 = std::operator!=(&local_38,(_Self *)&ref_1);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>
             ::operator->(&local_38);
    pbStack_48 = &(ppVar3->second).Path;
    _Var2 = std::operator==(pbStack_48,loc);
    if ((_Var2) && (*(LookupMethod *)(pbStack_48 + 1) == r._M_node._4_4_)) {
      this_local._7_1_ = true;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_a0,"Disagreement of the location of the \'");
      cmAlphaNum::cmAlphaNum(&local_d0,logical);
      args_1 = pbStack_48;
      local_e0 = (string_view)
                 AddReference::anon_class_1_0_00000001::operator()
                           (&local_49,*(LookupMethod *)(pbStack_48 + 1));
      local_f0 = (string_view)
                 AddReference::anon_class_1_0_00000001::operator()(&local_49,r._M_node._4_4_);
      cmStrCat<char[24],std::__cxx11::string,char[7],cm::static_string_view,char[16],std::__cxx11::string,char[7],cm::static_string_view,char[2]>
                (&local_70,&local_a0,&local_d0,(char (*) [24])"\' module. Location A: \'",args_1,
                 (char (*) [7])"\' via ",(static_string_view *)&local_e0,
                 (char (*) [16])"; Location B: \'",loc,(char (*) [7])"\' via ",
                 (static_string_view *)&local_f0,(char (*) [2])0xdea5a2);
      cmSystemTools::Error(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      this_local._7_1_ = false;
    }
  }
  else {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
              ::operator[](&this->Reference,logical);
    std::__cxx11::string::operator=((string *)this_00,(string *)loc);
    this_00->Method = r._M_node._4_4_;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CxxModuleUsage::AddReference(std::string const& logical,
                                  std::string const& loc, LookupMethod method)
{
  auto r = this->Reference.find(logical);
  if (r != this->Reference.end()) {
    auto& ref = r->second;

    if (ref.Path == loc && ref.Method == method) {
      return true;
    }

    auto method_name = [](LookupMethod m) -> cm::static_string_view {
      switch (m) {
        case LookupMethod::ByName:
          return "by-name"_s;
        case LookupMethod::IncludeAngle:
          return "include-angle"_s;
        case LookupMethod::IncludeQuote:
          return "include-quote"_s;
      }
      assert(false && "unsupported lookup method");
      return ""_s;
    };

    cmSystemTools::Error(cmStrCat("Disagreement of the location of the '",
                                  logical,
                                  "' module. "
                                  "Location A: '",
                                  ref.Path, "' via ", method_name(ref.Method),
                                  "; "
                                  "Location B: '",
                                  loc, "' via ", method_name(method), "."));
    return false;
  }

  auto& ref = this->Reference[logical];
  ref.Path = loc;
  ref.Method = method;

  return true;
}